

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verbose.c
# Opt level: O0

void print_gotos(int stateno)

{
  uint uVar1;
  shifts *psVar2;
  shifts *sp;
  Yshort *to_state;
  int as;
  int k;
  int i;
  int stateno_local;
  
  putc(10,(FILE *)verbose_file);
  psVar2 = shift_table[stateno];
  for (as = 0; as < psVar2->nshifts; as = as + 1) {
    uVar1 = psVar2->shift[as];
    if (start_symbol <= accessing_symbol[(int)uVar1]) {
      fprintf((FILE *)verbose_file,"\t%s  goto %d\n",symbol_name[accessing_symbol[(int)uVar1]],
              (ulong)uVar1);
    }
  }
  return;
}

Assistant:

void print_gotos(int stateno)
{
    register int i, k;
    register int as;
    register Yshort *to_state;
    register shifts *sp;

    putc('\n', verbose_file);
    sp = shift_table[stateno];
    to_state = sp->shift;
    for (i = 0; i < sp->nshifts; ++i)
    {
	k = to_state[i];
	as = accessing_symbol[k];
	if (ISVAR(as))
	    fprintf(verbose_file, "\t%s  goto %d\n", symbol_name[as], k);
    }
}